

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O2

char * rtosc_match_path(char *pattern,char *msg,char **path_end)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  ushort uVar4;
  ushort *puVar5;
  uint uVar6;
  uint uVar7;
  ushort **ppuVar8;
  char cVar9;
  char *local_38;
  
  local_38 = msg;
  if (path_end == (char **)0x0) {
    path_end = &local_38;
  }
LAB_0010315f:
  do {
    while( true ) {
      while( true ) {
        while (cVar3 = *pattern, cVar3 == '#') {
          ppuVar8 = __ctype_b_loc();
          pcVar1 = local_38;
          puVar5 = *ppuVar8;
          uVar4 = puVar5[pattern[1]];
          if ((uVar4 >> 0xb & 1) == 0) {
            return (char *)0x0;
          }
          if ((*(byte *)((long)puVar5 + (long)*local_38 * 2 + 1) & 8) == 0) {
            return (char *)0x0;
          }
          pattern = pattern + 1;
          uVar6 = atoi(pattern);
          uVar7 = atoi(pcVar1);
          while ((uVar4 >> 0xb & 1) != 0) {
            pcVar2 = pattern + 1;
            pattern = pattern + 1;
            uVar4 = puVar5[*pcVar2];
          }
          local_38 = pcVar1 + -1;
          do {
            pcVar1 = local_38 + 1;
            local_38 = local_38 + 1;
          } while ((*(byte *)((long)puVar5 + (long)*pcVar1 * 2 + 1) & 8) != 0);
          if (uVar6 <= uVar7) {
            return (char *)0x0;
          }
        }
        if (cVar3 != '{') break;
        pattern = rtosc_match_options(pattern,&local_38);
        if (pattern == (char *)0x0) {
          return (char *)0x0;
        }
      }
      if (cVar3 != '/') break;
      cVar9 = *local_38;
      if (cVar9 == '/') {
        local_38 = local_38 + 1;
        pcVar1 = pattern + 1;
        pattern = pattern + 1;
        if ((*pcVar1 == ':') || (*pcVar1 == '\0')) goto LAB_001032b5;
      }
      else {
LAB_001031fc:
        if (cVar3 != cVar9) {
          return (char *)0x0;
        }
        if (cVar3 == '\0') {
LAB_001032b5:
          *path_end = local_38;
          return pattern;
        }
        pattern = pattern + 1;
        local_38 = local_38 + 1;
      }
    }
    if (cVar3 == ':') {
      cVar9 = *local_38;
      if (cVar9 == '\0') goto LAB_001032b5;
      goto LAB_001031fc;
    }
    if (cVar3 != '*') {
      cVar9 = *local_38;
      goto LAB_001031fc;
    }
    while (cVar3 != '\0') {
      if ((cVar3 == '/') || (cVar3 == ':')) goto LAB_00103298;
      pcVar1 = pattern + 1;
      pattern = pattern + 1;
      cVar3 = *pcVar1;
    }
  } while( true );
LAB_00103298:
  for (; (*local_38 != '\0' && (*local_38 != '/')); local_38 = local_38 + 1) {
  }
  goto LAB_0010315f;
}

Assistant:

const char *rtosc_match_path(const char *pattern,
                             const char *msg, const char** path_end)
{
    if(!path_end)
        path_end = &msg; // writing *path_end = msg later will have no effect
    while(1) {
        //Check for special characters
        if(*pattern == ':' && !*msg)
            return *path_end = msg, pattern;
        else if(*pattern == '{') {
            pattern = rtosc_match_options(pattern, &msg);
            if(!pattern)
                return NULL;
        } else if(*pattern == '*') {
            //advance message and pattern to '/' or ':' and '\0'
            while(*pattern && *pattern != '/' && *pattern != ':')
                pattern++;
            if(*pattern == '/' || *pattern == ':')
                while(*msg && *msg != '/')
                    msg++;
        } else if(*pattern == '/' && *msg == '/') {
            ++pattern;
            ++msg;
            if(*pattern == '\0' || *pattern == ':')
                return *path_end = msg, pattern;
        } else if(*pattern == '#') {
            ++pattern;
            if(!rtosc_match_number(&pattern, &msg))
                return NULL;
        } else if((*pattern == *msg)) { //verbatim compare
            if(*msg)
                ++pattern, ++msg;
            else
                return *path_end = msg, pattern;
        } else
            return NULL;
    }
}